

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix * __thiscall Matrix::operator-=(Matrix *this,Matrix *mat)

{
  Matrix local_30;
  
  operator-(&local_30,this,mat);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->m_vals,&local_30.m_vals);
  (this->m_shape).field_0 = local_30.m_shape.field_0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_30.m_vals);
  return this;
}

Assistant:

Matrix& Matrix::operator-=(const Matrix& mat){
    *this=(*this)-mat;
    return *this;
}